

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

StringView __thiscall
Corrade::Containers::String::findOr(String *this,StringView substring,char *fail)

{
  StringView substring_00;
  BasicStringView<const_char> BVar1;
  StringView SVar2;
  BasicStringView<const_char> local_48;
  char *local_38;
  char *fail_local;
  String *this_local;
  StringView substring_local;
  
  substring_local._data = (char *)substring._sizePlusFlags;
  this_local = (String *)substring._data;
  local_38 = fail;
  fail_local = (char *)this;
  BasicStringView<const_char>::BasicStringView<const_char,_0>(&local_48,this);
  substring_00._sizePlusFlags = (size_t)substring_local._data;
  substring_00._data = (char *)this_local;
  BVar1 = BasicStringView<const_char>::findOr(&local_48,substring_00,local_38);
  SVar2._data = BVar1._data;
  SVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return SVar2;
}

Assistant:

StringView String::findOr(const StringView substring, const char* const fail) const {
    return StringView{*this}.findOr(substring, fail);
}